

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O3

lua_State * __thiscall ExtensionPoint::QueryParentThread(ExtensionPoint *this,lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *plVar3;
  
  iVar1 = (*lua_gettop)(L);
  lua_getglobal(L,ExtensionTable_abi_cxx11_._M_dataplus._M_p);
  iVar2 = (*lua_type)(L,-1);
  if (iVar2 == 5) {
    (*lua_getfield)(L,-1,"queryParentThread");
    iVar2 = (*lua_type)(L,-1);
    if (iVar2 == 6) {
      plVar3 = (lua_State *)0x0;
      iVar2 = lua_pcall(L,0,1,0);
      if (iVar2 == 0) {
        plVar3 = (*lua_tothread)(L,-1);
      }
      goto LAB_00130c7d;
    }
  }
  plVar3 = (lua_State *)0x0;
LAB_00130c7d:
  (*lua_settop)(L,iVar1);
  return plVar3;
}

Assistant:

lua_State* ExtensionPoint::QueryParentThread(lua_State* L)
{
	lua_State* PL = nullptr;
	const int t = lua_gettop(L);
	lua_getglobal(L, ExtensionTable.c_str());
	if (lua_istable(L, -1))
	{
		lua_getfield(L, -1, "queryParentThread");
		if (lua_isfunction(L, -1))
		{
			const auto r = lua_pcall(L, 0, 1, 0);
			if (r == LUA_OK)
			{
				PL = lua_tothread(L, -1);
			}
		}
	}
	lua_settop(L, t);

	return PL;
}